

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2map.c
# Opt level: O2

int json2map_calcEnd(jsmntok_t *token,int start,int end)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  
  lVar4 = (long)start;
  iVar2 = start + -1;
  piVar3 = &token[lVar4 + 1].start;
  do {
    lVar4 = lVar4 + 1;
    if (end <= lVar4) {
      return end + -1;
    }
    iVar1 = *piVar3;
    iVar2 = iVar2 + 1;
    piVar3 = piVar3 + 4;
  } while (iVar1 <= token[(uint)start].end);
  return iVar2;
}

Assistant:

static int json2map_calcEnd(jsmntok_t *token, int start, int end) {
	// TODO: optimize search
	DEBUG_TEXT("json2map_calcEnd([jsmntok_t *], %d, %d)...", start, end);
	int i;
	for ( i = start + 1; i < end; i++ ) {
		if ( token[i].start > token[start].end ) {
			DEBUG_TEXT("json2map_calcEnd([jsmntok_t *], %d, %d): return value=%d", start, end, i - 1);
			DEBUG_TEXT("json2map_calcEnd([jsmntok_t *], %d, %d)... DONE", start, end);
			return i - 1;
		}
	}
	DEBUG_TEXT("json2map_calcEnd([jsmntok_t *], %d, %d): return value=%d", start, end, end - 1);
	DEBUG_TEXT("json2map_calcEnd([jsmntok_t *], %d, %d)... DONE", start, end);
	return end - 1;
}